

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::make_loo_norm
          (quadratic_cost_type<long_double> *this,int n)

{
  int iVar1;
  longdouble lVar2;
  bool bVar3;
  pointer __first;
  pointer plVar4;
  longdouble *plVar5;
  type piVar6;
  type pqVar7;
  type plVar8;
  int local_38;
  int e_1;
  int i_2;
  int i_1;
  int e;
  int i;
  longdouble div;
  int local_14;
  quadratic_cost_type<long_double> *pqStack_10;
  int n_local;
  quadratic_cost_type<long_double> *this_local;
  
  local_14 = n;
  pqStack_10 = this;
  __first = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::get
                      (&this->linear_elements);
  plVar4 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::get
                     (&this->linear_elements);
  plVar5 = std::max_element<long_double*>(__first,plVar4 + local_14);
  _e = *plVar5;
  i_1 = 0;
  piVar6 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->indices,(long)local_14);
  iVar1 = *piVar6;
  for (; i_1 != iVar1; i_1 = i_1 + 1) {
    pqVar7 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)i_1);
    plVar5 = std::max<long_double>(&pqVar7->factor,(longdouble *)&e);
    _e = *plVar5;
  }
  bVar3 = std::isnormal(_e);
  if (bVar3) {
    for (e_1 = 0; lVar2 = _e, e_1 != local_14; e_1 = e_1 + 1) {
      plVar8 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->linear_elements,(long)e_1);
      *plVar8 = *plVar8 / lVar2;
    }
    local_38 = 0;
    piVar6 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->indices,(long)local_14);
    iVar1 = *piVar6;
    for (; lVar2 = _e, local_38 != iVar1; local_38 = local_38 + 1) {
      pqVar7 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<long_double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
               ::operator[](&this->quadratic_elements,(long)local_38);
      pqVar7->factor = pqVar7->factor / lVar2;
    }
  }
  return;
}

Assistant:

void make_loo_norm(int n)
    {
        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div = std::max(quadratic_elements[i].factor, div);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }